

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-cpuid.c
# Opt level: O0

int cpuid_is_vendor_intel(void)

{
  int iVar1;
  uint32_t local_28;
  uint32_t local_24;
  anon_union_16_2_94730047 vendor_id;
  asm_cpuid_data cpudata;
  
  memset(&local_28,0,0x10);
  asm_cpuid(0,(asm_cpuid_data *)(vendor_id.c + 8));
  local_28 = vendor_id.i[3];
  local_24 = cpudata.ebx;
  vendor_id.i[0] = cpudata.eax;
  iVar1 = strncmp((char *)&local_28,"GenuineIntel",0xd);
  return (int)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

int cpuid_is_vendor_intel(void) {
  asm_cpuid_data cpudata;
  union {
    char c[16];
    uint32_t i[16 / sizeof(uint32_t)];
  } vendor_id;
  memset(&vendor_id.c, 0, sizeof(vendor_id));
  asm_cpuid(0, &cpudata);
  vendor_id.i[0] = cpudata.ebx;
  vendor_id.i[1] = cpudata.edx;
  vendor_id.i[2] = cpudata.ecx;
  raplcap_log(DEBUG, "cpuid_is_vendor_intel: vendor_id=%s\n", vendor_id.c);
  return !strncmp(vendor_id.c, CPUID_VENDOR_ID_GENUINE_INTEL, sizeof(CPUID_VENDOR_ID_GENUINE_INTEL));
}